

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O0

void __thiscall QUndoGroup::setActiveStack(QUndoGroup *this,QUndoStack *stack)

{
  bool bVar1;
  QUndoGroupPrivate *this_00;
  int __c;
  QUndoStack *in_RSI;
  char *__s;
  QString *in_RDI;
  long in_FS_OFFSET;
  QUndoGroupPrivate *d;
  QUndoStack *in_stack_ffffffffffffff68;
  Connection local_68 [8];
  Connection local_60 [8];
  Connection local_58 [8];
  Connection local_50 [8];
  Connection local_48 [8];
  Connection local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QUndoGroup *)0xa88834);
  if (this_00->active != in_RSI) {
    if (this_00->active != (QUndoStack *)0x0) {
      QObject::disconnect((QObject *)this_00->active,"2canUndoChanged(bool)",(QObject *)in_RDI,
                          "2canUndoChanged(bool)");
      QObject::disconnect((QObject *)this_00->active,"2undoTextChanged(QString)",(QObject *)in_RDI,
                          "2undoTextChanged(QString)");
      QObject::disconnect((QObject *)this_00->active,"2canRedoChanged(bool)",(QObject *)in_RDI,
                          "2canRedoChanged(bool)");
      QObject::disconnect((QObject *)this_00->active,"2redoTextChanged(QString)",(QObject *)in_RDI,
                          "2redoTextChanged(QString)");
      QObject::disconnect((QObject *)this_00->active,"2indexChanged(int)",(QObject *)in_RDI,
                          "2indexChanged(int)");
      QObject::disconnect((QObject *)this_00->active,"2cleanChanged(bool)",(QObject *)in_RDI,
                          "2cleanChanged(bool)");
    }
    this_00->active = in_RSI;
    if (this_00->active == (QUndoStack *)0x0) {
      canUndoChanged((QUndoGroup *)0xa8892f,SUB81((ulong)in_RDI >> 0x38,0));
      QString::QString((QString *)0xa8893c);
      undoTextChanged((QUndoGroup *)this_00,in_RDI);
      QString::~QString((QString *)0xa8895a);
      canRedoChanged((QUndoGroup *)0xa88965,SUB81((ulong)in_RDI >> 0x38,0));
      QString::QString((QString *)0xa88972);
      redoTextChanged((QUndoGroup *)this_00,in_RDI);
      QString::~QString((QString *)0xa88990);
      cleanChanged((QUndoGroup *)0xa8899e,SUB81((ulong)in_RDI >> 0x38,0));
      indexChanged((QUndoGroup *)0xa889a9,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      QObject::connect((QObject *)local_40,(char *)this_00->active,
                       (QObject *)"2canUndoChanged(bool)",(char *)in_RDI,0xbf2a70);
      QMetaObject::Connection::~Connection(local_40);
      QObject::connect((QObject *)local_48,(char *)this_00->active,
                       (QObject *)"2undoTextChanged(QString)",(char *)in_RDI,0xbf2a86);
      QMetaObject::Connection::~Connection(local_48);
      QObject::connect((QObject *)local_50,(char *)this_00->active,
                       (QObject *)"2canRedoChanged(bool)",(char *)in_RDI,0xbf2aa0);
      QMetaObject::Connection::~Connection(local_50);
      QObject::connect((QObject *)local_58,(char *)this_00->active,
                       (QObject *)"2redoTextChanged(QString)",(char *)in_RDI,0xbf2ab6);
      QMetaObject::Connection::~Connection(local_58);
      QObject::connect((QObject *)local_60,(char *)this_00->active,(QObject *)"2indexChanged(int)",
                       (char *)in_RDI,0xbf2ad0);
      QMetaObject::Connection::~Connection(local_60);
      QObject::connect((QObject *)local_68,(char *)this_00->active,(QObject *)"2cleanChanged(bool)",
                       (char *)in_RDI,0xbf2ae3);
      QMetaObject::Connection::~Connection(local_68);
      QUndoStack::canUndo((QUndoStack *)in_RDI);
      canUndoChanged((QUndoGroup *)0xa88adf,SUB81((ulong)in_RDI >> 0x38,0));
      QUndoStack::undoText(in_RSI);
      undoTextChanged((QUndoGroup *)this_00,in_RDI);
      QString::~QString((QString *)0xa88b0a);
      QUndoStack::canRedo(in_RSI);
      canRedoChanged((QUndoGroup *)0xa88b27,SUB81((ulong)in_RDI >> 0x38,0));
      QUndoStack::redoText(in_stack_ffffffffffffff68);
      redoTextChanged((QUndoGroup *)this_00,in_RDI);
      QString::~QString((QString *)0xa88b52);
      bVar1 = QUndoStack::isClean((QUndoStack *)in_RDI);
      __s = (char *)(ulong)bVar1;
      cleanChanged((QUndoGroup *)0xa88b6f,SUB81((ulong)in_RDI >> 0x38,0));
      QUndoStack::index(this_00->active,__s,__c);
      indexChanged((QUndoGroup *)0xa88b88,(int)((ulong)in_RDI >> 0x20));
    }
    activeStackChanged((QUndoGroup *)0xa88b9a,(QUndoStack *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoGroup::setActiveStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);
    if (d->active == stack)
        return;

    if (d->active != nullptr) {
        disconnect(d->active, SIGNAL(canUndoChanged(bool)),
                    this, SIGNAL(canUndoChanged(bool)));
        disconnect(d->active, SIGNAL(undoTextChanged(QString)),
                    this, SIGNAL(undoTextChanged(QString)));
        disconnect(d->active, SIGNAL(canRedoChanged(bool)),
                    this, SIGNAL(canRedoChanged(bool)));
        disconnect(d->active, SIGNAL(redoTextChanged(QString)),
                    this, SIGNAL(redoTextChanged(QString)));
        disconnect(d->active, SIGNAL(indexChanged(int)),
                    this, SIGNAL(indexChanged(int)));
        disconnect(d->active, SIGNAL(cleanChanged(bool)),
                    this, SIGNAL(cleanChanged(bool)));
    }

    d->active = stack;

    if (d->active == nullptr) {
        emit canUndoChanged(false);
        emit undoTextChanged(QString());
        emit canRedoChanged(false);
        emit redoTextChanged(QString());
        emit cleanChanged(true);
        emit indexChanged(0);
    } else {
        connect(d->active, SIGNAL(canUndoChanged(bool)),
                this, SIGNAL(canUndoChanged(bool)));
        connect(d->active, SIGNAL(undoTextChanged(QString)),
                this, SIGNAL(undoTextChanged(QString)));
        connect(d->active, SIGNAL(canRedoChanged(bool)),
                this, SIGNAL(canRedoChanged(bool)));
        connect(d->active, SIGNAL(redoTextChanged(QString)),
                this, SIGNAL(redoTextChanged(QString)));
        connect(d->active, SIGNAL(indexChanged(int)),
                this, SIGNAL(indexChanged(int)));
        connect(d->active, SIGNAL(cleanChanged(bool)),
                this, SIGNAL(cleanChanged(bool)));
        emit canUndoChanged(d->active->canUndo());
        emit undoTextChanged(d->active->undoText());
        emit canRedoChanged(d->active->canRedo());
        emit redoTextChanged(d->active->redoText());
        emit cleanChanged(d->active->isClean());
        emit indexChanged(d->active->index());
    }

    emit activeStackChanged(d->active);
}